

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateCompositeConstructForComponentOfLoad
          (InterfaceVariableScalarReplacement *this,Instruction *load,uint32_t depth_to_component)

{
  Instruction *pIVar1;
  uint32_t uVar2;
  uint32_t res_id;
  DefUseManager *def_use_mgr;
  Instruction *this_00;
  iterator iVar3;
  __hashtable *__h;
  Instruction *this_01;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  def_use_mgr = IRContext::get_def_use_mgr((this->super_Pass).context_);
  uVar2 = Instruction::type_id(load);
  if (depth_to_component != 0) {
    uVar2 = Instruction::type_id(load);
    uVar2 = anon_unknown_0::GetComponentTypeOfArrayMatrix(def_use_mgr,uVar2,depth_to_component);
  }
  res_id = IRContext::TakeNextId((this->super_Pass).context_);
  this_00 = (Instruction *)::operator_new(0x70);
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Instruction::Instruction
            (this_00,(this->super_Pass).context_,OpCompositeConstruct,uVar2,res_id,&local_48);
  local_50._M_head_impl = this_00;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  analysis::DefUseManager::AnalyzeInstDefUse(def_use_mgr,this_00);
  pIVar1 = (load->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  this_01 = (Instruction *)0x0;
  if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
    this_01 = pIVar1;
  }
  while( true ) {
    uVar2 = Instruction::result_id(this_01);
    local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_48.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar2);
    iVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->composite_ids_to_component_depths)._M_h,(key_type_conflict *)&local_48);
    if ((iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
         == (__node_type *)0x0) ||
       (*(uint *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 0xc) <= depth_to_component)) break;
    this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if ((this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
      this_01 = (Instruction *)0x0;
    }
  }
  Instruction::InsertBefore
            (this_01,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_50);
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(depth_to_component,res_id);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->composite_ids_to_component_depths);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*((local_50._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return this_00;
}

Assistant:

Instruction*
InterfaceVariableScalarReplacement::CreateCompositeConstructForComponentOfLoad(
    Instruction* load, uint32_t depth_to_component) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t type_id = load->type_id();
  if (depth_to_component != 0) {
    type_id = GetComponentTypeOfArrayMatrix(def_use_mgr, load->type_id(),
                                            depth_to_component);
  }
  uint32_t new_id = context()->TakeNextId();
  std::unique_ptr<Instruction> new_composite_construct(new Instruction(
      context(), spv::Op::OpCompositeConstruct, type_id, new_id, {}));
  Instruction* composite_construct = new_composite_construct.get();
  def_use_mgr->AnalyzeInstDefUse(composite_construct);

  // Insert |new_composite_construct| after |load|. When there are multiple
  // recursive composite construct instructions for a load, we have to place the
  // composite construct with a lower depth later because it constructs the
  // composite that contains other composites with lower depths.
  auto* insert_before = load->NextNode();
  while (true) {
    auto itr =
        composite_ids_to_component_depths.find(insert_before->result_id());
    if (itr == composite_ids_to_component_depths.end()) break;
    if (itr->second <= depth_to_component) break;
    insert_before = insert_before->NextNode();
  }
  insert_before->InsertBefore(std::move(new_composite_construct));
  composite_ids_to_component_depths.insert({new_id, depth_to_component});
  return composite_construct;
}